

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_af3cfc::KeyData::KeyData(KeyData *this)

{
  long lVar1;
  byte bVar2;
  byte *pend;
  byte *pbVar3;
  CKey *in_RDI;
  long in_FS_OFFSET;
  CKey *in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdc4;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  undefined8 in_stack_fffffffffffffdd0;
  undefined1 uVar4;
  uchar *in_stack_fffffffffffffdd8;
  CKey *this_00;
  CKey *this_01;
  undefined4 local_1cf;
  undefined4 uStack_1cb;
  undefined4 uStack_1c7;
  undefined4 uStack_1c3;
  undefined4 local_1bf;
  undefined4 uStack_1bb;
  undefined4 uStack_1b7;
  undefined4 uStack_1b3;
  undefined4 local_1af;
  undefined4 uStack_1ab;
  undefined4 uStack_1a7;
  undefined4 uStack_1a3;
  undefined4 local_19f;
  undefined4 uStack_19b;
  undefined4 uStack_197;
  undefined4 uStack_193;
  undefined1 local_18f;
  undefined8 local_18e;
  undefined8 uStack_186;
  undefined8 local_17e;
  undefined8 uStack_176;
  undefined8 local_16e;
  undefined8 uStack_166;
  undefined8 local_15e;
  undefined8 uStack_156;
  undefined1 local_14e;
  undefined8 local_14d;
  undefined8 uStack_145;
  undefined8 local_13d;
  undefined8 uStack_135;
  undefined8 local_12d;
  undefined8 uStack_125;
  undefined8 local_11d;
  undefined8 uStack_115;
  undefined1 local_10d;
  undefined8 local_10c;
  undefined8 uStack_104;
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined8 local_ec;
  undefined8 uStack_e4;
  undefined8 local_dc;
  undefined8 uStack_d4;
  undefined1 local_cc;
  undefined8 local_cb;
  undefined8 uStack_c3;
  undefined8 local_bb;
  undefined8 uStack_b3;
  undefined8 local_ab;
  undefined8 uStack_a3;
  undefined8 local_9b;
  undefined8 uStack_93;
  undefined1 local_8b;
  undefined8 local_8a;
  undefined8 uStack_82;
  undefined8 local_7a;
  undefined8 uStack_72;
  undefined8 local_6a;
  undefined8 uStack_62;
  undefined8 local_5a;
  undefined8 uStack_52;
  undefined1 local_4a;
  undefined8 local_49;
  array<unsigned_char,_32UL> *paStack_41;
  undefined8 local_39;
  array<unsigned_char,_32UL> *paStack_31;
  undefined8 local_29;
  array<unsigned_char,_32UL> *paStack_21;
  undefined8 local_19;
  array<unsigned_char,_32UL> *paStack_11;
  bool local_9;
  
  uVar4 = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  CKey::CKey(in_stack_fffffffffffffdb8);
  this_01 = in_RDI + 1;
  CKey::CKey(in_stack_fffffffffffffdb8);
  CKey::CKey(in_stack_fffffffffffffdb8);
  CKey::CKey(in_stack_fffffffffffffdb8);
  CKey::CKey(in_stack_fffffffffffffdb8);
  CKey::CKey(in_stack_fffffffffffffdb8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdb8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdb8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdb8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdb8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdb8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdb8);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffdb8);
  CKey::Set<unsigned_char_const*>
            (this_01,&this_00->fCompressed,in_stack_fffffffffffffdd8,(bool)uVar4);
  CKey::Set<unsigned_char_const*>
            (this_01,&this_00->fCompressed,in_stack_fffffffffffffdd8,(bool)uVar4);
  CKey::GetPubKey(this_00);
  this_00[10].fCompressed = local_9;
  *(undefined8 *)(this_00 + 9) = local_19;
  this_00[9].keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl = paStack_11;
  *(undefined8 *)(this_00 + 8) = local_29;
  this_00[8].keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl = paStack_21;
  *(undefined8 *)(this_00 + 7) = local_39;
  this_00[7].keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl = paStack_31;
  *(undefined8 *)(this_00 + 6) = local_49;
  this_00[6].keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl = paStack_41;
  CKey::GetPubKey(this_00);
  this_00[0x12].field_0x2 = local_4a;
  *(undefined8 *)&this_00[0x11].field_0x2 = local_5a;
  *(undefined8 *)
   ((long)&this_00[0x11].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_52;
  *(undefined8 *)&this_00[0x10].field_0x2 = local_6a;
  *(undefined8 *)
   ((long)&this_00[0x10].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_62;
  *(undefined8 *)&this_00[0xf].field_0x2 = local_7a;
  *(undefined8 *)
   ((long)&this_00[0xf].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_72;
  *(undefined8 *)&this_00[0xe].field_0x2 = local_8a;
  *(undefined8 *)
   ((long)&this_00[0xe].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_82;
  CKey::GetPubKey(this_00);
  this_00[0xe].field_0x1 = local_8b;
  *(undefined8 *)&this_00[0xd].field_0x1 = local_9b;
  *(undefined8 *)
   ((long)&this_00[0xd].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 1) =
       uStack_93;
  *(undefined8 *)&this_00[0xc].field_0x1 = local_ab;
  *(undefined8 *)
   ((long)&this_00[0xc].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 1) =
       uStack_a3;
  *(undefined8 *)&this_00[0xb].field_0x1 = local_bb;
  *(undefined8 *)
   ((long)&this_00[0xb].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 1) =
       uStack_b3;
  *(undefined8 *)&this_00[10].field_0x1 = local_cb;
  *(undefined8 *)
   ((long)&this_00[10].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 1) =
       uStack_c3;
  pend = CPubKey::operator[]((CPubKey *)
                             CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                             in_stack_fffffffffffffdc4);
  bVar2 = *pend & 1 | 6;
  pbVar3 = CPubKey::data((CPubKey *)in_stack_fffffffffffffdb8);
  *pbVar3 = bVar2;
  CKey::Set<unsigned_char_const*>(this_01,&this_00->fCompressed,pend,SUB81((ulong)pbVar3 >> 0x38,0))
  ;
  uVar4 = (undefined1)((ulong)pbVar3 >> 0x38);
  CKey::Set<unsigned_char_const*>(this_01,&this_00->fCompressed,pend,(bool)uVar4);
  CKey::GetPubKey(this_00);
  this_00[0x16].field_0x3 = local_cc;
  *(undefined8 *)&this_00[0x15].field_0x3 = local_dc;
  *(undefined8 *)
   ((long)&this_00[0x15].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 3) =
       uStack_d4;
  *(undefined8 *)&this_00[0x14].field_0x3 = local_ec;
  *(undefined8 *)
   ((long)&this_00[0x14].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 3) =
       uStack_e4;
  *(undefined8 *)&this_00[0x13].field_0x3 = local_fc;
  *(undefined8 *)
   ((long)&this_00[0x13].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 3) =
       uStack_f4;
  *(undefined8 *)&this_00[0x12].field_0x3 = local_10c;
  *(undefined8 *)
   ((long)&this_00[0x12].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 3) =
       uStack_104;
  CKey::GetPubKey(this_00);
  this_00[0x1a].field_0x4 = local_10d;
  *(undefined8 *)&this_00[0x19].field_0x4 = local_11d;
  *(undefined8 *)
   ((long)&this_00[0x19].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 4) =
       uStack_115;
  *(undefined8 *)&this_00[0x18].field_0x4 = local_12d;
  *(undefined8 *)
   ((long)&this_00[0x18].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 4) =
       uStack_125;
  *(undefined8 *)&this_00[0x17].field_0x4 = local_13d;
  *(undefined8 *)
   ((long)&this_00[0x17].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 4) =
       uStack_135;
  *(undefined8 *)&this_00[0x16].field_0x4 = local_14d;
  *(undefined8 *)
   ((long)&this_00[0x16].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 4) =
       uStack_145;
  CKey::Set<unsigned_char_const*>(this_01,&this_00->fCompressed,pend,(bool)uVar4);
  CKey::Set<unsigned_char_const*>(this_01,&this_00->fCompressed,pend,(bool)uVar4);
  CKey::GetPubKey(this_00);
  this_00[0x1e].field_0x5 = local_14e;
  *(undefined8 *)&this_00[0x1d].field_0x5 = local_15e;
  *(undefined8 *)
   ((long)&this_00[0x1d].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 5) =
       uStack_156;
  *(undefined8 *)&this_00[0x1c].field_0x5 = local_16e;
  *(undefined8 *)
   ((long)&this_00[0x1c].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 5) =
       uStack_166;
  *(undefined8 *)&this_00[0x1b].field_0x5 = local_17e;
  *(undefined8 *)
   ((long)&this_00[0x1b].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 5) =
       uStack_176;
  *(undefined8 *)&this_00[0x1a].field_0x5 = local_18e;
  *(undefined8 *)
   ((long)&this_00[0x1a].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 5) =
       uStack_186;
  CKey::GetPubKey(this_00);
  this_00[0x22].field_0x6 = local_18f;
  *(undefined4 *)&this_00[0x21].field_0x6 = local_19f;
  *(undefined4 *)
   ((long)&this_00[0x21].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_19b;
  *(undefined4 *)
   ((long)&this_00[0x21].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 6) =
       uStack_197;
  *(undefined4 *)&this_00[0x22].field_0x2 = uStack_193;
  *(undefined4 *)&this_00[0x20].field_0x6 = local_1af;
  *(undefined4 *)
   ((long)&this_00[0x20].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_1ab;
  *(undefined4 *)
   ((long)&this_00[0x20].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 6) =
       uStack_1a7;
  *(undefined4 *)&this_00[0x21].field_0x2 = uStack_1a3;
  *(undefined4 *)&this_00[0x1f].field_0x6 = local_1bf;
  *(undefined4 *)
   ((long)&this_00[0x1f].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_1bb;
  *(undefined4 *)
   ((long)&this_00[0x1f].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 6) =
       uStack_1b7;
  *(undefined4 *)&this_00[0x20].field_0x2 = uStack_1b3;
  *(undefined4 *)&this_00[0x1e].field_0x6 = local_1cf;
  *(undefined4 *)
   ((long)&this_00[0x1e].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 2) =
       uStack_1cb;
  *(undefined4 *)
   ((long)&this_00[0x1e].keydata._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl + 6) =
       uStack_1c7;
  *(undefined4 *)&this_00[0x1f].field_0x2 = uStack_1c3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

KeyData()
    {
        key0.Set(vchKey0, vchKey0 + 32, false);
        key0C.Set(vchKey0, vchKey0 + 32, true);
        pubkey0 = key0.GetPubKey();
        pubkey0H = key0.GetPubKey();
        pubkey0C = key0C.GetPubKey();
        *const_cast<unsigned char*>(pubkey0H.data()) = 0x06 | (pubkey0H[64] & 1);

        key1.Set(vchKey1, vchKey1 + 32, false);
        key1C.Set(vchKey1, vchKey1 + 32, true);
        pubkey1 = key1.GetPubKey();
        pubkey1C = key1C.GetPubKey();

        key2.Set(vchKey2, vchKey2 + 32, false);
        key2C.Set(vchKey2, vchKey2 + 32, true);
        pubkey2 = key2.GetPubKey();
        pubkey2C = key2C.GetPubKey();
    }